

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsBlurEffect::setBlurHints(QGraphicsBlurEffect *this,BlurHints hints)

{
  long lVar1;
  QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4> QVar2;
  
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  QVar2.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i =
       (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
       QPixmapBlurFilter::blurHints(*(QPixmapBlurFilter **)(lVar1 + 0xa8));
  if (QVar2.super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i ==
      (QFlagsStorage<QGraphicsBlurEffect::BlurHint>)
      hints.super_QFlagsStorageHelper<QGraphicsBlurEffect::BlurHint,_4>.
      super_QFlagsStorage<QGraphicsBlurEffect::BlurHint>.i) {
    return;
  }
  QPixmapBlurFilter::setBlurHints(*(QPixmapBlurFilter **)(lVar1 + 0xa8),hints);
  blurHintsChanged(this,hints);
  return;
}

Assistant:

void QGraphicsBlurEffect::setBlurHints(QGraphicsBlurEffect::BlurHints hints)
{
    Q_D(QGraphicsBlurEffect);
    if (d->filter->blurHints() == hints)
        return;

    d->filter->setBlurHints(hints);
    emit blurHintsChanged(hints);
}